

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O2

void variance16_avx2(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int h,__m256i *vsse,
                    __m256i *vsum)

{
  __m256i src_00;
  __m256i ref_00;
  long lVar1;
  longlong unaff_RBX;
  undefined8 unaff_R12;
  int i;
  int iVar2;
  undefined8 unaff_R13;
  undefined8 unaff_R14;
  longlong unaff_R15;
  undefined4 in_stack_ffffffffffffffb8;
  
  (*vsum)[0] = 0;
  (*vsum)[1] = 0;
  (*vsum)[2] = 0;
  (*vsum)[3] = 0;
  lVar1 = (long)src_stride;
  for (iVar2 = 0; iVar2 < h; iVar2 = iVar2 + 2) {
    src_00[0]._4_4_ = h;
    src_00[0]._0_4_ = in_stack_ffffffffffffffb8;
    src_00[1] = lVar1;
    src_00[2] = (longlong)vsse;
    src_00[3] = unaff_RBX;
    ref_00[1] = unaff_R13;
    ref_00[0] = unaff_R12;
    ref_00[2] = unaff_R14;
    ref_00[3] = unaff_R15;
    variance_kernel_avx2(src_00,ref_00,vsse,vsum);
  }
  return;
}

Assistant:

static inline void variance16_avx2(const uint8_t *src, const int src_stride,
                                   const uint8_t *ref, const int ref_stride,
                                   const int h, __m256i *const vsse,
                                   __m256i *const vsum) {
  *vsum = _mm256_setzero_si256();

  for (int i = 0; i < h; i += 2) {
    variance16_kernel_avx2(src, src_stride, ref, ref_stride, vsse, vsum);
    src += 2 * src_stride;
    ref += 2 * ref_stride;
  }
}